

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

bool __thiscall libtorrent::aux::listen_socket_t::can_route(listen_socket_t *this,address *addr)

{
  address *a1;
  bool bVar1;
  bool bVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  bitfield_flag local_f9;
  address local_f8;
  address local_d8;
  address local_b8;
  address_v6 local_98;
  address local_80;
  address_v6 local_60;
  address local_48;
  undefined1 local_23;
  uchar local_22;
  bitfield_flag local_21;
  address *local_20;
  address *addr_local;
  listen_socket_t *this_local;
  
  local_22 = (this->flags).m_val;
  local_23 = 8;
  local_20 = addr;
  addr_local = (address *)this;
  local_21 = (bitfield_flag)
             libtorrent::flags::operator&
                       ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                         )local_22,
                        (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                         )0x8);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_21);
  if (bVar1) {
    this_local._7_1_ = true;
  }
  else {
    bVar1 = is_v4<boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>>(&this->local_endpoint);
    bVar2 = boost::asio::ip::address::is_v4(local_20);
    if (bVar1 == bVar2) {
      boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                (&local_48,&this->local_endpoint);
      bVar2 = boost::asio::ip::address::is_v6(&local_48);
      bVar1 = false;
      if (bVar2) {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  (&local_80,&this->local_endpoint);
        boost::asio::ip::address::to_v6(&local_60,&local_80);
        uVar3 = boost::asio::ip::address_v6::scope_id(&local_60);
        boost::asio::ip::address::to_v6(&local_98,local_20);
        uVar4 = boost::asio::ip::address_v6::scope_id(&local_98);
        bVar1 = uVar3 != uVar4;
      }
      if (bVar1) {
        this_local._7_1_ = false;
      }
      else {
        boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                  (&local_b8,&this->local_endpoint);
        bVar1 = boost::asio::ip::operator==(&local_b8,local_20);
        if (bVar1) {
          this_local._7_1_ = true;
        }
        else {
          boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                    (&local_d8,&this->local_endpoint);
          bVar1 = boost::asio::ip::address::is_unspecified(&local_d8);
          a1 = local_20;
          if (bVar1) {
            this_local._7_1_ = true;
          }
          else {
            boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::address
                      (&local_f8,&this->local_endpoint);
            bVar1 = match_addr_mask(a1,&local_f8,&this->netmask);
            if (bVar1) {
              this_local._7_1_ = true;
            }
            else {
              local_f9 = (bitfield_flag)
                         libtorrent::flags::operator&
                                   ((bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                     )(this->flags).m_val,
                                    (bitfield_flag<unsigned_char,_libtorrent::aux::listen_socket_flags_tag,_void>
                                     )0x2);
              bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_f9);
              this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
            }
          }
        }
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool listen_socket_t::can_route(address const& addr) const
	{
		// if this is a proxy, we assume it can reach everything
		if (flags & proxy) return true;

		if (is_v4(local_endpoint) != addr.is_v4()) return false;

		if (local_endpoint.address().is_v6()
			&& local_endpoint.address().to_v6().scope_id() != addr.to_v6().scope_id())
			return false;

		if (local_endpoint.address() == addr) return true;
		if (local_endpoint.address().is_unspecified()) return true;
		if (match_addr_mask(addr, local_endpoint.address(), netmask)) return true;
		return !(flags & local_network);
	}